

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_delta_box_node(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  REF_DBL m [6];
  REF_DBL m_int [6];
  double local_c8 [4];
  undefined8 uStack_a8;
  double local_a0;
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  lVar6 = 0;
  lVar4 = 0;
  do {
    if (ref_node->max <= lVar4) {
      return 0;
    }
    if (-1 < ref_node->global[lVar4]) {
      uVar2 = ref_node_metric_get(ref_node,(REF_INT)lVar4,local_98);
      if (uVar2 != 0) {
        pcVar5 = "get";
        uVar3 = 0x19f;
        goto LAB_0019edac;
      }
      pRVar1 = ref_node->real;
      dVar7 = *(double *)((long)pRVar1 + lVar6 + 8);
      dVar9 = *(double *)((long)pRVar1 + lVar6 + 0x10);
      dVar8 = dVar9 * 0.0 + *(double *)((long)pRVar1 + lVar6) * 0.90631 + dVar7 * 0.42262;
      dVar7 = dVar7 - dVar8 * 0.42262;
      dVar9 = dVar8 * -0.0 + dVar9;
      dVar8 = dVar8 * -0.90631 + *(double *)((long)pRVar1 + lVar6);
      dVar7 = (SQRT(dVar8 * dVar8 + dVar7 * dVar7 + dVar9 * dVar9) * 0.002) / 0.06339299999999999 +
              0.0003;
      if (0.007 <= dVar7) {
        dVar7 = 0.007;
      }
      local_c8[0] = 1.0 / (dVar7 * dVar7);
      local_a0 = local_c8[0];
      if (1.1 < *(double *)((long)pRVar1 + lVar6)) {
        dVar9 = (*(double *)((long)pRVar1 + lVar6) + -1.1) / 3.9;
        dVar7 = 0.0;
        if (0.0 <= dVar9) {
          dVar7 = dVar9;
        }
        dVar9 = 1.0;
        if (dVar7 <= 1.0) {
          dVar9 = dVar7;
        }
        dVar7 = (1.0 - dVar9) * 0.007 + dVar9 * 0.07;
        local_c8[0] = 1.0 / (dVar7 * dVar7);
        local_a0 = 20408.16326530612;
      }
      dVar7 = *(double *)((long)pRVar1 + lVar6 + 8);
      dVar9 = *(double *)((long)pRVar1 + lVar6 + 0x10);
      if (ABS(dVar9) <= 0.1) {
        dVar8 = *(double *)((long)pRVar1 + lVar6);
        if ((1.0 < dVar7) || (dVar8 < -0.1)) goto LAB_0019ec61;
      }
      else {
        dVar8 = *(double *)((long)pRVar1 + lVar6);
LAB_0019ec61:
        if (dVar9 <= -dVar9) {
          dVar9 = -dVar9;
        }
        if (dVar7 <= -dVar7) {
          dVar7 = -dVar7;
        }
        if (dVar8 <= -dVar8) {
          dVar8 = -dVar8;
        }
        dVar7 = dVar8 / 5.0 + dVar7 / 5.0 + dVar9 / 5.0 + 0.1;
        local_c8[0] = 1.0 / (dVar7 * dVar7);
        local_a0 = local_c8[0];
      }
      uStack_a8 = 0;
      local_c8[2] = 0.0;
      local_c8[1] = 0.0;
      local_c8[3] = local_a0;
      uVar2 = ref_matrix_intersect(local_c8,local_98,local_68);
      if (uVar2 != 0) {
        pcVar5 = "intersect";
        uVar3 = 0x1cd;
LAB_0019edac:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar3,"ref_metric_delta_box_node",(ulong)uVar2,pcVar5);
        return uVar2;
      }
      uVar2 = ref_node_metric_set(ref_node,(REF_INT)lVar4,local_68);
      if (uVar2 != 0) {
        pcVar5 = "set node met";
        uVar3 = 0x1ce;
        goto LAB_0019edac;
      }
    }
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x78;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_delta_box_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL m[6], m_int[6], m_target[6];
  REF_DBL radius, h;
  REF_DBL factor = 1.0;
  REF_DBL n[3], dot;

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    n[0] = 0.90631;
    n[1] = 0.42262;
    n[2] = 0.0;
    dot = ref_math_dot(n, ref_node_xyz_ptr(ref_node, node));
    radius = sqrt(pow(ref_node_xyz(ref_node, 0, node) - dot * n[0], 2) +
                  pow(ref_node_xyz(ref_node, 1, node) - dot * n[1], 2) +
                  pow(ref_node_xyz(ref_node, 2, node) - dot * n[2], 2));
    h = MIN(0.0003 + 0.002 * radius / (0.15 * 0.42262), 0.007);
    h *= factor;
    m_target[0] = 1.0 / (h * h);
    m_target[1] = 0;
    m_target[2] = 0;
    m_target[3] = 1.0 / (h * h);
    m_target[4] = 0;
    m_target[5] = 1.0 / (h * h);
    if (ref_node_xyz(ref_node, 0, node) > 1.1) {
      REF_DBL ht, s, hx;
      ht = 0.007;
      s = (ref_node_xyz(ref_node, 0, node) - 1.1) / 3.9;
      s = MIN(1.0, MAX(0.0, s));
      hx = ht * (1.0 - s) + 10 * ht * s;
      hx *= factor;
      ht *= factor;
      m_target[0] = 1.0 / (hx * hx);
      m_target[1] = 0;
      m_target[2] = 0;
      m_target[3] = 1.0 / (ht * ht);
      m_target[4] = 0;
      m_target[5] = 1.0 / (ht * ht);
    }
    if (0.1 < ref_node_xyz(ref_node, 2, node) ||
        -0.1 > ref_node_xyz(ref_node, 2, node) ||
        1.0 < ref_node_xyz(ref_node, 1, node) ||
        -0.1 > ref_node_xyz(ref_node, 0, node)) {
      h = 0.1 + ABS(ref_node_xyz(ref_node, 2, node)) / 5.0 +
          ABS(ref_node_xyz(ref_node, 1, node)) / 5.0 +
          ABS(ref_node_xyz(ref_node, 0, node)) / 5.0;
      h *= factor;
      m_target[0] = 1.0 / (h * h);
      m_target[1] = 0;
      m_target[2] = 0;
      m_target[3] = 1.0 / (h * h);
      m_target[4] = 0;
      m_target[5] = 1.0 / (h * h);
    }
    RSS(ref_matrix_intersect(m_target, m, m_int), "intersect");
    RSS(ref_node_metric_set(ref_node, node, m_int), "set node met");
  }

  return REF_SUCCESS;
}